

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleTabletEvent(QWidgetWindow *this,QTabletEvent *event)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  KeyboardModifiers KVar4;
  QPointingDevice *pQVar5;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  qreal qVar11;
  QWidget *widget;
  QTabletEvent ev;
  QPointF mapped;
  QPointF delta;
  MouseButton in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QFlagsStorage<Qt::MouseButton> in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  QFlagsStorage<Qt::MouseButton> in_stack_fffffffffffffe6c;
  QPointF *in_stack_fffffffffffffe70;
  QWidget *this_00;
  QWidget *local_128;
  QPointF local_110;
  QTabletEvent local_100 [96];
  QPointF local_a0;
  QPoint local_90;
  QPoint local_88;
  QPointF local_70;
  QPointF local_60;
  QPoint local_50;
  QPointF local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((handleTabletEvent(QTabletEvent*)::qt_tablet_target == '\0') &&
     (iVar2 = __cxa_guard_acquire(&handleTabletEvent(QTabletEvent*)::qt_tablet_target), iVar2 != 0))
  {
    __cxa_atexit(QPointer<QWidget>::~QPointer,&handleTabletEvent::qt_tablet_target,&__dso_handle);
    __cxa_guard_release(&handleTabletEvent(QTabletEvent*)::qt_tablet_target);
  }
  local_128 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b6da5);
  if (local_128 == (QWidget *)0x0) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b6dca);
    local_18 = QSinglePointEvent::position((QSinglePointEvent *)0x3b6ddc);
    local_128 = QWidget::childAt((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i),
                                 (QPointF *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (local_128 == (QWidget *)0x0) {
      local_128 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b6e21);
    }
    TVar3 = QEvent::type(in_RSI);
    if (TVar3 == TabletPress) {
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i),
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  if (local_128 != (QWidget *)0x0) {
    local_28.yp = -NAN;
    local_28.xp = -NAN;
    local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b6e8b);
    local_60 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b6eaa);
    local_50 = QPointF::toPoint(in_stack_fffffffffffffe70);
    QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_28 = ::operator-((QPointF *)
                           CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                           (QPointF *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i));
    local_70.yp = -NAN;
    local_70.xp = -NAN;
    this_00 = local_128;
    local_a0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b6f45);
    local_90 = QPointF::toPoint((QPointF *)this_00);
    local_88 = QWidget::mapFromGlobal
                         (this_00,(QPoint *)
                                  CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68));
    QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_70 = ::operator+((QPointF *)
                           CONCAT44(in_stack_fffffffffffffe6c.i,in_stack_fffffffffffffe68),
                           (QPointF *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i));
    memcpy(local_100,&DAT_00aa4c40,0x60);
    TVar3 = QEvent::type(in_RSI);
    pQVar5 = (QPointingDevice *)QPointerEvent::pointingDevice();
    local_110 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x3b700b);
    qVar6 = QTabletEvent::pressure((QTabletEvent *)0x3b702a);
    qVar7 = QTabletEvent::xTilt((QTabletEvent *)in_RSI);
    qVar8 = QTabletEvent::yTilt((QTabletEvent *)in_RSI);
    qVar9 = QTabletEvent::tangentialPressure((QTabletEvent *)in_RSI);
    qVar10 = QTabletEvent::rotation((QTabletEvent *)0x3b7082);
    qVar11 = QTabletEvent::z((QTabletEvent *)in_RSI);
    KVar4 = QInputEvent::modifiers
                      ((QInputEvent *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i));
    in_stack_fffffffffffffe58 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    in_stack_fffffffffffffe60.i =
         (Int)QSinglePointEvent::buttons
                        ((QSinglePointEvent *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i));
    QTabletEvent::QTabletEvent
              (local_100,TVar3,pQVar5,(QPointF *)&local_70,(QPointF *)&local_110,qVar6,(float)qVar7,
               (float)qVar8,(float)qVar9,qVar10,(float)qVar11,
               (QFlags_conflict1 *)
               (ulong)(uint)KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i,in_stack_fffffffffffffe58,
               (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i));
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QPointerEvent::setTimestamp((ulonglong)local_100);
    QPointerEvent::setAccepted(false);
    QCoreApplication::forwardEvent(&local_128->super_QObject,(QEvent *)local_100,in_RSI);
    bVar1 = QEvent::isAccepted((QEvent *)local_100);
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    QTabletEvent::~QTabletEvent(local_100);
  }
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == TabletRelease) {
    QSinglePointEvent::buttons
              ((QSinglePointEvent *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i))
    ;
    bVar1 = ::operator==((QFlags<Qt::MouseButton>)in_stack_fffffffffffffe6c.i,
                         in_stack_fffffffffffffe60.i);
    if (bVar1) {
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.i),
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleTabletEvent(QTabletEvent *event)
{
    static QPointer<QWidget> qt_tablet_target = nullptr;

    QWidget *widget = qt_tablet_target;

    if (!widget) {
        widget = m_widget->childAt(event->position());
        if (!widget)
            widget = m_widget;
        if (event->type() == QEvent::TabletPress)
            qt_tablet_target = widget;
    }

    if (widget) {
        QPointF delta = event->globalPosition() - event->globalPosition().toPoint();
        QPointF mapped = widget->mapFromGlobal(event->globalPosition().toPoint()) + delta;
        QTabletEvent ev(event->type(), event->pointingDevice(), mapped, event->globalPosition(),
                        event->pressure(), event->xTilt(), event->yTilt(), event->tangentialPressure(),
                        event->rotation(), event->z(), event->modifiers(), event->button(), event->buttons());
        ev.setTimestamp(event->timestamp());
        ev.setAccepted(false);
        QGuiApplication::forwardEvent(widget, &ev, event);
        event->setAccepted(ev.isAccepted());
    }

    if (event->type() == QEvent::TabletRelease && event->buttons() == Qt::NoButton)
        qt_tablet_target = nullptr;
}